

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdbloom.cc
# Opt level: O1

string * __thiscall
bloomFilter::getFilter_abi_cxx11_(string *__return_storage_ptr__,bloomFilter *this)

{
  void *__ptr;
  pointer puVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  int i;
  uint uVar5;
  char *pcVar6;
  ulong __size;
  
  uVar5 = (uint)((this->mFilterBits & 7) != 0) + (this->mFilterBits >> 3);
  if (uVar5 == 0) {
    poVar2 = (ostream *)&std::cerr;
    pcVar6 = "(EE) Error. Cannot allocate memory for 0 byte in ";
    lVar3 = 0x31;
  }
  else {
    __size = (ulong)uVar5;
    __ptr = malloc(__size);
    if (__ptr != (void *)0x0) {
      puVar1 = (this->mBits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = 0;
      do {
        *(undefined1 *)((long)__ptr + uVar4) = 0;
        lVar3 = 0;
        do {
          if (puVar1[lVar3] != '\0') {
            *(byte *)((long)__ptr + uVar4) =
                 *(byte *)((long)__ptr + uVar4) | (byte)(1 << ((byte)lVar3 & 0x1f));
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 != 8);
        uVar4 = uVar4 + 1;
        puVar1 = puVar1 + 8;
      } while (uVar4 != __size);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      uVar4 = 0;
      do {
        bd_sprintf_append(__return_storage_ptr__,"%02lx",(ulong)*(byte *)((long)__ptr + uVar4));
        uVar4 = uVar4 + 1;
      } while (__size != uVar4);
      free(__ptr);
      return __return_storage_ptr__;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"(EE) Error. Cannot allocate memory for ",0x27);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cerr,uVar5);
    pcVar6 = " bytes in ";
    lVar3 = 10;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar6,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"std::string bloomFilter::getFilter()",0x24);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string bloomFilter::getFilter() {
	/* extract filter as a hex string */
	int bytes = (mFilterBits / BITS_PER_BYTE);
	if (mFilterBits % BITS_PER_BYTE) {
		bytes++;
	}

	if (bytes==0) {
		std::cerr << "(EE) Error. Cannot allocate memory for 0 byte in " << __PRETTY_FUNCTION__ << std::endl;
		return std::string();
	}
	// convert to binary array.
	uint8_t *tmparray = (uint8_t *) malloc(bytes);
    
    	if (tmparray == NULL) {
            std::cerr << "(EE) Error. Cannot allocate memory for " << bytes << " bytes in " << __PRETTY_FUNCTION__ << std::endl;
            return std::string();
        }
        
	int i,j;
	
	for (i = 0; i < bytes; i++) {
		tmparray[i] = 0;
		for (j = 0; j < BITS_PER_BYTE; j++) {
			int bit = i * BITS_PER_BYTE + j;
			if (mBits[bit]) {
				tmparray[i] |= (1 << j);
			}
		}
	}

	std::string out;
	for (int i = 0; i < bytes; i++) {
		bd_sprintf_append(out, "%02lx",  (uint32_t) (tmparray)[i]);
	}

	free(tmparray);

	return out;
}